

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

uint __thiscall Memory::HeapBucket::GetBucketIndex(HeapBucket *this)

{
  uint uVar1;
  
  uVar1 = HeapInfo::GetBucketIndex((ulong)this->sizeCat);
  return uVar1;
}

Assistant:

uint
HeapBucket::GetBucketIndex() const
{
    return HeapInfo::GetBucketIndex(this->sizeCat);
}